

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_withPrefix64k(char *source,char *dest,int originalSize)

{
  char *pcVar1;
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort *puVar5;
  ulong uVar6;
  size_t l_1;
  ulong uVar7;
  uint uVar8;
  size_t l;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  BYTE *op;
  ushort *__src;
  char cVar12;
  int local_40;
  
  pcVar11 = dest + originalSize;
  pcVar1 = dest + -0x10000;
  puVar5 = (ushort *)source;
  do {
    uVar3 = *puVar5;
    __src = (ushort *)((long)puVar5 + 1);
    uVar8 = (uint)(byte)((byte)uVar3 >> 4);
    uVar10 = (ulong)uVar8;
    if (uVar8 == 0xf) {
      lVar9 = 0;
      do {
        uVar4 = *__src;
        __src = (ushort *)((long)__src + 1);
        lVar9 = lVar9 + (ulong)(byte)uVar4;
      } while ((ulong)(byte)uVar4 == 0xff);
      uVar10 = lVar9 + 0xf;
    }
    cVar12 = '\0';
    if ((ulong)((long)pcVar11 - (long)dest) < uVar10) {
      cVar12 = '\x01';
LAB_003214b2:
      bVar2 = false;
    }
    else {
      memmove(dest,__src,uVar10);
      dest = dest + uVar10;
      __src = (ushort *)((long)__src + uVar10);
      bVar2 = true;
      if ((ulong)((long)pcVar11 - (long)dest) < 0xc) {
        cVar12 = (dest == pcVar11) * '\x02' + '\x01';
        goto LAB_003214b2;
      }
    }
    puVar5 = __src;
    if (bVar2) {
      uVar10 = (ulong)((byte)uVar3 & 0xf);
      puVar5 = __src + 1;
      if (uVar10 == 0xf) {
        lVar9 = 0;
        do {
          uVar3 = *puVar5;
          puVar5 = (ushort *)((long)puVar5 + 1);
          lVar9 = lVar9 + (ulong)(byte)uVar3;
        } while ((ulong)(byte)uVar3 == 0xff);
        uVar10 = lVar9 + 0xf;
      }
      uVar10 = uVar10 + 4;
      cVar12 = '\x01';
      if (uVar10 <= (ulong)((long)pcVar11 - (long)dest)) {
        uVar6 = (ulong)*__src;
        if (uVar6 <= (ulong)((long)dest - (long)pcVar1)) {
          if (uVar10 != 0) {
            uVar7 = 0;
            do {
              dest[uVar7] = dest[uVar7 - uVar6];
              uVar7 = uVar7 + 1;
            } while (uVar10 != uVar7);
          }
          if (uVar6 <= (ulong)((long)dest - (long)pcVar1)) {
            dest = dest + uVar10;
            cVar12 = (ulong)((long)pcVar11 - (long)dest) < 5;
          }
        }
      }
    }
    if (cVar12 != '\0') {
      if (cVar12 == '\x03') {
        local_40 = (int)source;
        local_40 = (int)puVar5 - local_40;
      }
      else {
        local_40 = -1;
      }
      return local_40;
    }
  } while( true );
}

Assistant:

int LZ4_decompress_fast_withPrefix64k(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                64 KB, NULL, 0);
}